

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O2

void * parseContent(SymbolContext<char> *ctx)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar4 = 0;
  lVar3 = ctx->symbol->start;
  uVar7 = (int)ctx->symbol->end - (int)lVar3;
  lVar3 = (long)ctx->context->m_window + lVar3;
  uVar5 = ~((int)uVar7 >> 0x1f) & uVar7;
  while ((uVar6 = uVar5, uVar5 != uVar4 && (iVar1 = isspace(uVar4), uVar6 = uVar4, iVar1 != 0))) {
    uVar4 = uVar4 + 1;
  }
  psVar2 = (string *)operator_new(0x20);
  if (uVar6 == uVar7) {
    *(string **)psVar2 = psVar2 + 0x10;
    *(undefined8 *)(psVar2 + 8) = 0;
    psVar2[0x10] = (string)0x0;
  }
  else {
    *(string **)psVar2 = psVar2 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar2,lVar3,(int)uVar7 + lVar3);
  }
  return psVar2;
}

Assistant:

const std::string& get_content() const
    {
        return m_content;
    }